

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_helper.c
# Opt level: O2

void riscv_cpu_do_interrupt_riscv64(CPUState *cs)

{
  CPURISCVState_conflict1 *env;
  uint uVar1;
  TranslationBlock *pTVar2;
  char cVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  byte bVar8;
  uint uVar9;
  long lVar10;
  TranslationBlock *pTVar11;
  TranslationBlock **ppTVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  TranslationBlock *pTVar16;
  TranslationBlock *pTVar17;
  ulong uVar18;
  
  cVar3 = (char)cs[1].tb_jmp_cache[0x18a];
  if (cVar3 < '\0') {
    bVar8 = *(byte *)(cs[1].tb_jmp_cache + 0x18e) >> 1;
  }
  else {
    bVar8 = 0;
  }
  uVar1 = cs->exception_index;
  uVar6 = uVar1 & 0x7fffffff;
  ppTVar12 = cs[1].tb_jmp_cache + 0x19a;
  if ((int)uVar1 < 0) {
    ppTVar12 = cs[1].tb_jmp_cache + 0x195;
  }
  if ((int)uVar1 < 0) {
    pTVar16 = (TranslationBlock *)0x0;
  }
  else {
    pTVar16 = (TranslationBlock *)0x0;
    if (uVar6 < 0x18) {
      if ((0xb0f3U >> (uVar1 & 0x1f) & 1) == 0) {
        if ((0xb00000U >> (uVar1 & 0x1f) & 1) == 0) goto LAB_00aa09cf;
        bVar8 = 1;
      }
      pTVar16 = cs[1].tb_jmp_cache[0x187];
    }
LAB_00aa09cf:
    if (uVar6 == 8) {
      pTVar11 = cs[1].tb_jmp_cache[0x18d];
      if ((TranslationBlock *)0x3 < pTVar11) {
        __assert_fail("env->priv <= 3",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/riscv/cpu_helper.c"
                      ,0x35d,"void riscv_cpu_do_interrupt_riscv64(CPUState *)");
      }
      if (pTVar11 == (TranslationBlock *)0x3) {
        uVar6 = 0xb;
      }
      else if (pTVar11 == (TranslationBlock *)&DAT_00000001) {
        if (cVar3 < '\0') {
          uVar6 = (*(uint *)(cs[1].tb_jmp_cache + 0x18e) & 1) + 9;
        }
        else {
          uVar6 = 9;
        }
      }
      else {
        uVar6 = 8;
      }
    }
  }
  env = (CPURISCVState_conflict1 *)(cs[1].tb_jmp_cache + 0x143);
  uVar18 = (ulong)uVar6;
  if ((uVar6 < 0x40) && (cs[1].tb_jmp_cache[0x18d] < (TranslationBlock *)&DAT_00000002)) {
    pTVar11 = (TranslationBlock *)&DAT_00000001;
    if (((ulong)*ppTVar12 >> (uVar18 & 0x3f) & 1) != 0) {
      if (cVar3 < '\0') {
        if ((((ulong)cs[1].tb_jmp_cache[0x18e] & 1) == 0) ||
           ((1L << ((byte)uVar6 & 0x3f) & (ulong)cs[1].tb_jmp_cache[(ulong)(uVar1 >> 0x1f) + 0x1a3])
            == 0)) {
          if (((ulong)cs[1].tb_jmp_cache[0x18e] & 1) != 0) goto LAB_00aa0bfe;
          pTVar17 = cs[1].tb_jmp_cache[0x188];
          cs[1].tb_jmp_cache[0x1a2] =
               (TranslationBlock *)
               ((ulong)(((uint)cs[1].tb_jmp_cache[0x18e] & 1) << 7) |
               (ulong)((uint)cs[1].tb_jmp_cache[0x191] & 0x100) |
               ((ulong)cs[1].tb_jmp_cache[0x1a2] & 0xfffffffffffffc7f) +
               (ulong)((uint)cs[1].tb_jmp_cache[0x1a2] & 0x80) * 4);
        }
        else {
          if ((bVar8 & 1) == 0) {
            uVar18 = uVar18 - (uVar18 == 10 || (uVar6 & 0x3b) == 2);
            goto LAB_00aa0a3c;
          }
LAB_00aa0bfe:
          riscv_cpu_swap_hypervisor_regs_riscv64(env);
          if (((ulong)cs[1].tb_jmp_cache[0x18a] & 0x80) == 0) {
            uVar5 = 0;
          }
          else {
            uVar5 = (ulong)(((uint)cs[1].tb_jmp_cache[0x18e] & 1) << 7);
          }
          cs[1].tb_jmp_cache[0x1a2] =
               (TranslationBlock *)
               (uVar5 | (ulong)((uint)cs[1].tb_jmp_cache[0x191] & 0x100) |
                        ((ulong)cs[1].tb_jmp_cache[0x1a2] & 0xfffffffffffffc7f) +
                        (ulong)((uint)cs[1].tb_jmp_cache[0x1a2] & 0x80) * 4);
          pTVar17 = cs[1].tb_jmp_cache[0x188];
          riscv_cpu_set_virt_enabled_riscv64(env,false);
          if (((ulong)cs[1].tb_jmp_cache[0x18a] & 0x80) != 0) {
            *(byte *)(cs[1].tb_jmp_cache + 0x18e) = *(byte *)(cs[1].tb_jmp_cache + 0x18e) & 0xfd;
          }
        }
      }
      else {
LAB_00aa0a3c:
        pTVar17 = (TranslationBlock *)0x0;
      }
      pTVar2 = cs[1].tb_jmp_cache[0x191];
      if (cs[1].tb_jmp_cache[0x189] < (TranslationBlock *)0x11000) {
        uVar6 = (uint)cs[1].tb_jmp_cache[0x18d];
        bVar8 = (byte)cs[1].tb_jmp_cache[0x18d];
        uVar9 = 1 << (bVar8 & 0x1f);
        uVar9 = (uint)(((ulong)pTVar2 & (long)(int)uVar9) /
                      (ulong)(long)(int)(uVar9 & ~(2 << (bVar8 & 0x1f))));
      }
      else {
        uVar9 = (uint)((ulong)pTVar2 >> 1);
        uVar6 = (uint)cs[1].tb_jmp_cache[0x18d];
      }
      cs[1].tb_jmp_cache[0x191] =
           (TranslationBlock *)
           ((ulong)pTVar2 & 0xfffffffffffffedd | (ulong)((uVar6 & 1) << 8) |
           (ulong)((uVar9 & 1) << 5));
      uVar5 = (ulong)(uVar1 >> 0x1f) << 0x3f | uVar18;
      lVar7 = 0x8fd0;
      lVar10 = 0x9028;
      lVar13 = 0x8fb8;
      lVar14 = 0x8fd8;
      lVar15 = 0x8fe0;
      goto LAB_00aa0d1b;
    }
  }
  if (cVar3 < '\0') {
    if (((ulong)cs[1].tb_jmp_cache[0x18e] & 1) != 0) {
      riscv_cpu_swap_hypervisor_regs_riscv64(env);
      cVar3 = (char)cs[1].tb_jmp_cache[0x18a];
    }
    uVar5 = (ulong)cs[1].tb_jmp_cache[0x191] & 0xffffff3fffffffff;
    if (cVar3 < '\0') {
      uVar6 = (uint)cs[1].tb_jmp_cache[0x18e];
      uVar5 = uVar5 | (ulong)(uVar6 & 1) << 0x27;
      uVar4 = (ulong)(uVar6 & 2) << 0x25;
    }
    else {
      uVar4 = 0;
    }
    cs[1].tb_jmp_cache[0x191] = (TranslationBlock *)(uVar5 | uVar4);
    pTVar17 = cs[1].tb_jmp_cache[0x188];
    riscv_cpu_set_virt_enabled_riscv64(env,false);
    if (((ulong)cs[1].tb_jmp_cache[0x18a] & 0x80) != 0) {
      *(byte *)(cs[1].tb_jmp_cache + 0x18e) = *(byte *)(cs[1].tb_jmp_cache + 0x18e) & 0xfd;
    }
  }
  else {
    pTVar17 = (TranslationBlock *)0x0;
  }
  pTVar11 = cs[1].tb_jmp_cache[0x191];
  if (cs[1].tb_jmp_cache[0x189] < (TranslationBlock *)0x11000) {
    uVar6 = (uint)cs[1].tb_jmp_cache[0x18d];
    bVar8 = (byte)cs[1].tb_jmp_cache[0x18d];
    uVar9 = 1 << (bVar8 & 0x1f);
    uVar9 = (uint)(((ulong)pTVar11 & (long)(int)uVar9) /
                  (ulong)(long)(int)(uVar9 & ~(2 << (bVar8 & 0x1f))));
  }
  else {
    uVar9 = (uint)((ulong)pTVar11 >> 3);
    uVar6 = (uint)cs[1].tb_jmp_cache[0x18d];
  }
  cs[1].tb_jmp_cache[0x191] =
       (TranslationBlock *)
       ((ulong)pTVar11 & 0xffffffffffffe777 | (ulong)((uVar6 & 3) << 0xb) |
       (ulong)((uVar9 & 1) << 7));
  uVar5 = ~(0xffffffffffffffffU >> (byte)(uVar1 >> 0x1f)) | uVar18;
  pTVar11 = (TranslationBlock *)0x3;
  lVar7 = 0x8fe8;
  lVar10 = 0x9080;
  lVar13 = 0x8fc0;
  lVar14 = 0x8ff0;
  lVar15 = 0x8ff8;
LAB_00aa0d1b:
  *(ulong *)((long)cs->jmp_env[0].__jmpbuf + lVar15 + -0x40) = uVar5;
  *(TranslationBlock **)((long)cs->jmp_env[0].__jmpbuf + lVar14 + -0x40) = cs[1].tb_jmp_cache[0x183]
  ;
  *(TranslationBlock **)((long)cs->jmp_env[0].__jmpbuf + lVar13 + -0x40) = pTVar16;
  *(TranslationBlock **)((long)cs->jmp_env[0].__jmpbuf + lVar10 + -0x40) = pTVar17;
  uVar5 = *(ulong *)((long)cs->jmp_env[0].__jmpbuf + lVar7 + -0x40);
  lVar7 = uVar18 << 2;
  if (((uint)uVar5 & 3) != 1) {
    lVar7 = 0;
  }
  if (-1 < (int)uVar1) {
    lVar7 = 0;
  }
  cs[1].tb_jmp_cache[0x183] = (TranslationBlock *)(lVar7 + (uVar5 & 0xfffffffffffffffc));
  cs[1].tb_jmp_cache[0x18d] = pTVar11;
  cs[1].tb_jmp_cache[0x184] = (TranslationBlock *)0xffffffffffffffff;
  cs->exception_index = -1;
  return;
}

Assistant:

void riscv_cpu_do_interrupt(CPUState *cs)
{
    RISCVCPU *cpu = RISCV_CPU(cs);
    CPURISCVState *env = &cpu->env;
    bool force_hs_execp = riscv_cpu_force_hs_excep_enabled(env);
    target_ulong s;

    /* cs->exception is 32-bits wide unlike mcause which is XLEN-bits wide
     * so we mask off the MSB and separate into trap type and cause.
     */
    bool async = !!(cs->exception_index & RISCV_EXCP_INT_FLAG);
    target_ulong cause = cs->exception_index & RISCV_EXCP_INT_MASK;
    target_ulong deleg = async ? env->mideleg : env->medeleg;
    target_ulong tval = 0;
    target_ulong htval = 0;
    target_ulong mtval2 = 0;

    if (!async) {
        /* set tval to badaddr for traps with address information */
        switch (cause) {
        case RISCV_EXCP_INST_GUEST_PAGE_FAULT:
        case RISCV_EXCP_LOAD_GUEST_ACCESS_FAULT:
        case RISCV_EXCP_STORE_GUEST_AMO_ACCESS_FAULT:
            force_hs_execp = true;
            /* fallthrough */
        case RISCV_EXCP_INST_ADDR_MIS:
        case RISCV_EXCP_INST_ACCESS_FAULT:
        case RISCV_EXCP_LOAD_ADDR_MIS:
        case RISCV_EXCP_STORE_AMO_ADDR_MIS:
        case RISCV_EXCP_LOAD_ACCESS_FAULT:
        case RISCV_EXCP_STORE_AMO_ACCESS_FAULT:
        case RISCV_EXCP_INST_PAGE_FAULT:
        case RISCV_EXCP_LOAD_PAGE_FAULT:
        case RISCV_EXCP_STORE_PAGE_FAULT:
            tval = env->badaddr;
            break;
        default:
            break;
        }
        /* ecall is dispatched as one cause so translate based on mode */
        if (cause == RISCV_EXCP_U_ECALL) {
            assert(env->priv <= 3);

            if (env->priv == PRV_M) {
                cause = RISCV_EXCP_M_ECALL;
            } else if (env->priv == PRV_S && riscv_cpu_virt_enabled(env)) {
                cause = RISCV_EXCP_VS_ECALL;
            } else if (env->priv == PRV_S && !riscv_cpu_virt_enabled(env)) {
                cause = RISCV_EXCP_S_ECALL;
            } else if (env->priv == PRV_U) {
                cause = RISCV_EXCP_U_ECALL;
            }
        }
    }

    if (env->priv <= PRV_S &&
            cause < TARGET_LONG_BITS && ((deleg >> cause) & 1)) {
        /* handle the trap in S-mode */
        if (riscv_has_ext(env, RVH)) {
            target_ulong hdeleg = async ? env->hideleg : env->hedeleg;

            if (riscv_cpu_virt_enabled(env) && ((hdeleg >> cause) & 1) &&
                !force_hs_execp) {
                /*
                 * See if we need to adjust cause. Yes if its VS mode interrupt
                 * no if hypervisor has delegated one of hs mode's interrupt
                 */
                if (cause == IRQ_VS_TIMER || cause == IRQ_VS_SOFT ||
                    cause == IRQ_VS_EXT)
                    cause = cause - 1;
                /* Trap to VS mode */
            } else if (riscv_cpu_virt_enabled(env)) {
                /* Trap into HS mode, from virt */
                riscv_cpu_swap_hypervisor_regs(env);
                env->hstatus = set_field(env->hstatus, HSTATUS_SP2V,
                                         get_field(env->hstatus, HSTATUS_SPV));
                env->hstatus = set_field(env->hstatus, HSTATUS_SP2P,
                                         get_field(env->mstatus, SSTATUS_SPP));
                env->hstatus = set_field(env->hstatus, HSTATUS_SPV,
                                         riscv_cpu_virt_enabled(env));

                htval = env->guest_phys_fault_addr;

                riscv_cpu_set_virt_enabled(env, 0);
                riscv_cpu_set_force_hs_excep(env, 0);
            } else {
                /* Trap into HS mode */
                env->hstatus = set_field(env->hstatus, HSTATUS_SP2V,
                                         get_field(env->hstatus, HSTATUS_SPV));
                env->hstatus = set_field(env->hstatus, HSTATUS_SP2P,
                                         get_field(env->mstatus, SSTATUS_SPP));
                env->hstatus = set_field(env->hstatus, HSTATUS_SPV,
                                         riscv_cpu_virt_enabled(env));

                htval = env->guest_phys_fault_addr;
            }
        }

        s = env->mstatus;
        s = set_field(s, MSTATUS_SPIE, env->priv_ver >= PRIV_VERSION_1_10_0 ?
            get_field(s, MSTATUS_SIE) : get_field(s, MSTATUS_UIE << env->priv));
        s = set_field(s, MSTATUS_SPP, env->priv);
        s = set_field(s, MSTATUS_SIE, 0);
        env->mstatus = s;
        env->scause = cause | ((target_ulong)async << (TARGET_LONG_BITS - 1));
        env->sepc = env->pc;
        env->sbadaddr = tval;
        env->htval = htval;
        env->pc = (env->stvec >> 2 << 2) +
            ((async && (env->stvec & 3) == 1) ? cause * 4 : 0);
        riscv_cpu_set_mode(env, PRV_S);
    } else {
        /* handle the trap in M-mode */
        if (riscv_has_ext(env, RVH)) {
            if (riscv_cpu_virt_enabled(env)) {
                riscv_cpu_swap_hypervisor_regs(env);
            }
#ifdef TARGET_RISCV32
            env->mstatush = set_field(env->mstatush, MSTATUS_MPV,
                                       riscv_cpu_virt_enabled(env));
            env->mstatush = set_field(env->mstatush, MSTATUS_MTL,
                                       riscv_cpu_force_hs_excep_enabled(env));
#else
            env->mstatus = set_field(env->mstatus, MSTATUS_MPV,
                                      riscv_cpu_virt_enabled(env));
            env->mstatus = set_field(env->mstatus, MSTATUS_MTL,
                                      riscv_cpu_force_hs_excep_enabled(env));
#endif

            mtval2 = env->guest_phys_fault_addr;

            /* Trapping to M mode, virt is disabled */
            riscv_cpu_set_virt_enabled(env, 0);
            riscv_cpu_set_force_hs_excep(env, 0);
        }

        s = env->mstatus;
        s = set_field(s, MSTATUS_MPIE, env->priv_ver >= PRIV_VERSION_1_10_0 ?
            get_field(s, MSTATUS_MIE) : get_field(s, MSTATUS_UIE << env->priv));
        s = set_field(s, MSTATUS_MPP, env->priv);
        s = set_field(s, MSTATUS_MIE, 0);
        env->mstatus = s;
        env->mcause = cause | ~(((target_ulong)-1) >> async);
        env->mepc = env->pc;
        env->mbadaddr = tval;
        env->mtval2 = mtval2;
        env->pc = (env->mtvec >> 2 << 2) +
            ((async && (env->mtvec & 3) == 1) ? cause * 4 : 0);
        riscv_cpu_set_mode(env, PRV_M);
    }

    /* NOTE: it is not necessary to yield load reservations here. It is only
     * necessary for an SC from "another hart" to cause a load reservation
     * to be yielded. Refer to the memory consistency model section of the
     * RISC-V ISA Specification.
     */

    cs->exception_index = EXCP_NONE; /* mark handled to qemu */
}